

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::add_hlsl_resource_binding
          (CompilerHLSL *this,HLSLResourceBinding *binding)

{
  mapped_type *this_00;
  bool local_55;
  pair<spirv_cross::HLSLResourceBinding,_bool> local_54;
  undefined1 local_24 [8];
  StageSetBinding tuple;
  HLSLResourceBinding *binding_local;
  CompilerHLSL *this_local;
  
  local_24._0_4_ = binding->stage;
  local_24._4_4_ = binding->desc_set;
  tuple.model = binding->binding;
  local_55 = false;
  tuple._4_8_ = binding;
  ::std::pair<spirv_cross::HLSLResourceBinding,_bool>::pair<bool,_true>(&local_54,binding,&local_55)
  ;
  this_00 = ::std::
            unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>_>
            ::operator[](&this->resource_bindings,(key_type *)local_24);
  ::std::pair<spirv_cross::HLSLResourceBinding,_bool>::operator=(this_00,&local_54);
  return;
}

Assistant:

void CompilerHLSL::add_hlsl_resource_binding(const HLSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };
}